

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cp.c
# Opt level: O3

void i2cp_begin(i2cp_state *state)

{
  long lVar1;
  uint8_t *puVar2;
  ushort uVar3;
  ushort uVar4;
  uint8_t b;
  uint8_t local_9;
  
  if (state->sentinit == false) {
    local_9 = '*';
    (*state->write)(state->writeimpl,&local_9,1);
    uVar3 = (state->writebuf).sz;
    if (uVar3 < 0x20) {
      uVar4 = (state->writebuf).idx;
      lVar1 = (ulong)uVar4 * 0x10000 + (ulong)uVar4 * 4;
      (state->writebuf).sz = uVar3 + 1;
      (state->writebuf).idx = uVar4 + 1 & 0x1f;
      puVar2 = (state->writebuf).buffs[0].buf + lVar1 + -4;
      puVar2[0] = '\x0e';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\t';
      puVar2 = (state->writebuf).buffs[0].buf + lVar1 + 4;
      puVar2[0] = ' ';
      puVar2[1] = '\x06';
      puVar2 = (state->writebuf).buffs[0].buf + lVar1 + 6;
      puVar2[0] = '0';
      puVar2[1] = '.';
      puVar2[2] = '9';
      puVar2[3] = '.';
      puVar2[4] = '3';
      puVar2[5] = '2';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
    }
    i2cp_flush_write(state);
    state->sentinit = true;
  }
  return;
}

Assistant:

void i2cp_begin(struct i2cp_state * state)
{
  if(!state->sentinit)
  {
    // protocol byte
    uint8_t b = 0x2a;
    i2cp_write_msg(&b, 1, state);

    // get date messagee
    struct i2cp_stringbuf str;
    i2cp_putstring(&str, I2CP_VERSION);
    uint32_t sz = i2cp_buflen(&str);
    // empty mapping
    htobe16buf(str.data + sz, 0);
    sz += 2;
    i2cp_queue_send(state, GETDATE, str.data, sz);
    i2cp_flush_write(state);
    state->sentinit = true;
  }
}